

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O0

void __thiscall MetaCommand::ListOptions(MetaCommand *this)

{
  bool bVar1;
  ostream *poVar2;
  void *pvVar3;
  char *pcVar4;
  ulong uVar5;
  reference pOVar6;
  size_type sVar7;
  reference pFVar8;
  long in_RDI;
  const_iterator itField;
  int i;
  const_iterator it;
  ostream *in_stack_ffffffffffffff28;
  ostream *in_stack_ffffffffffffff30;
  MetaCommand *in_stack_ffffffffffffff98;
  string local_58 [32];
  Field *local_38;
  __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
  local_30;
  Option *local_28;
  int local_1c;
  Option *local_18;
  __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
  local_10 [2];
  
  local_18 = (Option *)
             std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::begin
                       ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)
                        in_stack_ffffffffffffff28);
  __gnu_cxx::
  __normal_iterator<MetaCommand::Option_const*,std::vector<MetaCommand::Option,std::allocator<MetaCommand::Option>>>
  ::__normal_iterator<MetaCommand::Option*>
            ((__normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
              *)in_stack_ffffffffffffff30,
             (__normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
              *)in_stack_ffffffffffffff28);
  local_1c = 0;
  while( true ) {
    local_28 = (Option *)
               std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::end
                         ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)
                          in_stack_ffffffffffffff28);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                        *)in_stack_ffffffffffffff30,
                       (__normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                        *)in_stack_ffffffffffffff28);
    if (!bVar1) break;
    poVar2 = std::operator<<((ostream *)&std::cout,"Option #");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,local_1c);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"   Name: ");
    __gnu_cxx::
    __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
    ::operator*(local_10);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    poVar2 = std::operator<<(poVar2,pcVar4);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
    ::operator*(local_10);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"   Tag: ");
      __gnu_cxx::
      __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
      ::operator*(local_10);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      poVar2 = std::operator<<(poVar2,pcVar4);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"   Description: ");
    __gnu_cxx::
    __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
    ::operator*(local_10);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    poVar2 = std::operator<<(poVar2,pcVar4);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    pOVar6 = __gnu_cxx::
             __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
             ::operator*(local_10);
    if ((pOVar6->required & 1U) == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"   Required: false");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"   Required: true");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"   Number of expected values: ");
    pOVar6 = __gnu_cxx::
             __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
             ::operator*(local_10);
    sVar7 = std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::size
                      (&pOVar6->fields);
    pvVar3 = (void *)std::ostream::operator<<(poVar2,sVar7);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
    ::operator*(local_10);
    local_30._M_current =
         (Field *)std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::begin
                            ((vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_> *)
                             in_stack_ffffffffffffff28);
    while( true ) {
      __gnu_cxx::
      __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
      ::operator*(local_10);
      local_38 = (Field *)std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::end
                                    ((vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>
                                      *)in_stack_ffffffffffffff28);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                          *)in_stack_ffffffffffffff30,
                         (__normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                          *)in_stack_ffffffffffffff28);
      if (!bVar1) break;
      in_stack_ffffffffffffff30 = std::operator<<((ostream *)&std::cout,"      Field Name: ");
      __gnu_cxx::
      __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
      ::operator*(&local_30);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      poVar2 = std::operator<<(in_stack_ffffffffffffff30,pcVar4);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,"      Description: ");
      __gnu_cxx::
      __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
      ::operator*(&local_30);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      poVar2 = std::operator<<(poVar2,pcVar4);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,"      Type: ");
      __gnu_cxx::
      __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
      ::operator*(&local_30);
      TypeToString_abi_cxx11_(in_stack_ffffffffffffff98,(TypeEnumType)((ulong)in_RDI >> 0x20));
      pcVar4 = (char *)std::__cxx11::string::c_str();
      poVar2 = std::operator<<(poVar2,pcVar4);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_58);
      in_stack_ffffffffffffff28 = std::operator<<((ostream *)&std::cout,"      Value: ");
      __gnu_cxx::
      __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
      ::operator*(&local_30);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      poVar2 = std::operator<<(in_stack_ffffffffffffff28,pcVar4);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      pFVar8 = __gnu_cxx::
               __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
               ::operator*(&local_30);
      if (pFVar8->externaldata == DATA_NONE) {
        poVar2 = std::operator<<((ostream *)&std::cout,"      External Data: false");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,"      External Data: true");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      pFVar8 = __gnu_cxx::
               __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
               ::operator*(&local_30);
      if ((pFVar8->required & 1U) == 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"      Required: false");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,"      Required: true");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      __gnu_cxx::
      __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
      ::operator++(&local_30);
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    local_1c = local_1c + 1;
    __gnu_cxx::
    __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
    ::operator++(local_10);
  }
  if (*(long *)(in_RDI + 0xc0) != 0) {
    (**(code **)(in_RDI + 0xc0))();
  }
  return;
}

Assistant:

void MetaCommand::ListOptions()
{
  OptionVector::const_iterator it = m_OptionVector.begin();
  int i=0;
  while(it != m_OptionVector.end())
    {
    METAIO_STREAM::cout << "Option #" << i << METAIO_STREAM::endl;
    METAIO_STREAM::cout << "   Name: " <<  (*it).name.c_str() << METAIO_STREAM::endl;
    if (!(*it).tag.empty()) {
      METAIO_STREAM::cout << "   Tag: " << (*it).tag.c_str() << METAIO_STREAM::endl;
    }
    METAIO_STREAM::cout << "   Description: " << (*it).description.c_str() << METAIO_STREAM::endl;
    if((*it).required)
      {
      METAIO_STREAM::cout << "   Required: true" << METAIO_STREAM::endl;
      }
    else
      {
      METAIO_STREAM::cout << "   Required: false" << METAIO_STREAM::endl;
      }
    METAIO_STREAM::cout << "   Number of expected values: " << (*it).fields.size()
                                              << METAIO_STREAM::endl;

    auto itField = (*it).fields.begin();
    while(itField != (*it).fields.end())
      {
      METAIO_STREAM::cout << "      Field Name: " <<  (*itField).name.c_str()
                                        << METAIO_STREAM::endl;
      METAIO_STREAM::cout << "      Description: " << (*itField).description.c_str()
                                         << METAIO_STREAM::endl;
      METAIO_STREAM::cout << "      Type: " << this->TypeToString((*itField).type).c_str()
                                  << METAIO_STREAM::endl;
      METAIO_STREAM::cout << "      Value: " << (*itField).value.c_str() << METAIO_STREAM::endl;

      if((*itField).externaldata)
        {
        METAIO_STREAM::cout << "      External Data: true" << METAIO_STREAM::endl;
        }
      else
        {
        METAIO_STREAM::cout << "      External Data: false" << METAIO_STREAM::endl;
        }

      if((*itField).required)
        {
        METAIO_STREAM::cout << "      Required: true" << METAIO_STREAM::endl;
        }
      else
        {
        METAIO_STREAM::cout << "      Required: false" << METAIO_STREAM::endl;
        }
      ++itField;
      }
    METAIO_STREAM::cout << METAIO_STREAM::endl;
    ++i;
    ++it;
    }
    if (m_HelpCallBack != nullptr) {
      m_HelpCallBack();
    }
}